

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.cpp
# Opt level: O1

path * boost::filesystem::detail::relative
                 (path *__return_storage_ptr__,path *p,path *base,error_code *ec)

{
  bool bVar1;
  path wc_p;
  path wc_base;
  error_code tmp_ec;
  path local_78;
  path local_58;
  error_code local_38;
  
  local_38.m_val = 0;
  local_38.m_cat = system::system_category();
  weakly_canonical(&local_58,base,&local_38);
  bVar1 = anon_unknown.dwarf_59c2::error(local_38.m_val,base,ec,"boost::filesystem::relative");
  if (bVar1) {
    (__return_storage_ptr__->m_pathname)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_pathname).field_2;
    (__return_storage_ptr__->m_pathname)._M_string_length = 0;
    (__return_storage_ptr__->m_pathname).field_2._M_local_buf[0] = '\0';
  }
  else {
    weakly_canonical(&local_78,p,&local_38);
    bVar1 = anon_unknown.dwarf_59c2::error(local_38.m_val,base,ec,"boost::filesystem::relative");
    if (bVar1) {
      (__return_storage_ptr__->m_pathname)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_pathname).field_2;
      (__return_storage_ptr__->m_pathname)._M_string_length = 0;
      (__return_storage_ptr__->m_pathname).field_2._M_local_buf[0] = '\0';
    }
    else {
      path::lexically_relative(__return_storage_ptr__,&local_78,&local_58);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.m_pathname._M_dataplus._M_p != &local_78.m_pathname.field_2) {
      operator_delete(local_78.m_pathname._M_dataplus._M_p,
                      local_78.m_pathname.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.m_pathname._M_dataplus._M_p != &local_58.m_pathname.field_2) {
    operator_delete(local_58.m_pathname._M_dataplus._M_p,
                    local_58.m_pathname.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

BOOST_FILESYSTEM_DECL
  path relative(const path& p, const path& base, error_code* ec)
  {
    error_code tmp_ec;
    path wc_base(weakly_canonical(base, &tmp_ec));
    if (error(tmp_ec.value(), base, ec, "boost::filesystem::relative"))
      return path();
    path wc_p(weakly_canonical(p, &tmp_ec));
    if (error(tmp_ec.value(), base, ec, "boost::filesystem::relative"))
      return path();
    return wc_p.lexically_relative(wc_base);
  }